

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O3

void fiat_id_GostR3410_2001_TestParamSet_from_bytes(uint64_t *out1,uint8_t *arg1)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  
  uVar1 = *(uint64_t *)(arg1 + 8);
  uVar2 = *(uint64_t *)(arg1 + 0x10);
  uVar3 = *(uint64_t *)(arg1 + 0x18);
  *out1 = *(uint64_t *)arg1;
  out1[1] = uVar1;
  out1[2] = uVar2;
  out1[3] = uVar3;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_from_bytes(
    uint64_t out1[4], const uint8_t arg1[32]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint8_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    uint64_t x14;
    uint64_t x15;
    uint8_t x16;
    uint64_t x17;
    uint64_t x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    uint64_t x23;
    uint8_t x24;
    uint64_t x25;
    uint64_t x26;
    uint64_t x27;
    uint64_t x28;
    uint64_t x29;
    uint64_t x30;
    uint64_t x31;
    uint8_t x32;
    uint64_t x33;
    uint64_t x34;
    uint64_t x35;
    uint64_t x36;
    uint64_t x37;
    uint64_t x38;
    uint64_t x39;
    uint64_t x40;
    uint64_t x41;
    uint64_t x42;
    uint64_t x43;
    uint64_t x44;
    uint64_t x45;
    uint64_t x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    uint64_t x54;
    uint64_t x55;
    uint64_t x56;
    uint64_t x57;
    uint64_t x58;
    uint64_t x59;
    uint64_t x60;
    x1 = ((uint64_t)(arg1[31]) << 56);
    x2 = ((uint64_t)(arg1[30]) << 48);
    x3 = ((uint64_t)(arg1[29]) << 40);
    x4 = ((uint64_t)(arg1[28]) << 32);
    x5 = ((uint64_t)(arg1[27]) << 24);
    x6 = ((uint64_t)(arg1[26]) << 16);
    x7 = ((uint64_t)(arg1[25]) << 8);
    x8 = (arg1[24]);
    x9 = ((uint64_t)(arg1[23]) << 56);
    x10 = ((uint64_t)(arg1[22]) << 48);
    x11 = ((uint64_t)(arg1[21]) << 40);
    x12 = ((uint64_t)(arg1[20]) << 32);
    x13 = ((uint64_t)(arg1[19]) << 24);
    x14 = ((uint64_t)(arg1[18]) << 16);
    x15 = ((uint64_t)(arg1[17]) << 8);
    x16 = (arg1[16]);
    x17 = ((uint64_t)(arg1[15]) << 56);
    x18 = ((uint64_t)(arg1[14]) << 48);
    x19 = ((uint64_t)(arg1[13]) << 40);
    x20 = ((uint64_t)(arg1[12]) << 32);
    x21 = ((uint64_t)(arg1[11]) << 24);
    x22 = ((uint64_t)(arg1[10]) << 16);
    x23 = ((uint64_t)(arg1[9]) << 8);
    x24 = (arg1[8]);
    x25 = ((uint64_t)(arg1[7]) << 56);
    x26 = ((uint64_t)(arg1[6]) << 48);
    x27 = ((uint64_t)(arg1[5]) << 40);
    x28 = ((uint64_t)(arg1[4]) << 32);
    x29 = ((uint64_t)(arg1[3]) << 24);
    x30 = ((uint64_t)(arg1[2]) << 16);
    x31 = ((uint64_t)(arg1[1]) << 8);
    x32 = (arg1[0]);
    x33 = (x31 + (uint64_t)x32);
    x34 = (x30 + x33);
    x35 = (x29 + x34);
    x36 = (x28 + x35);
    x37 = (x27 + x36);
    x38 = (x26 + x37);
    x39 = (x25 + x38);
    x40 = (x23 + (uint64_t)x24);
    x41 = (x22 + x40);
    x42 = (x21 + x41);
    x43 = (x20 + x42);
    x44 = (x19 + x43);
    x45 = (x18 + x44);
    x46 = (x17 + x45);
    x47 = (x15 + (uint64_t)x16);
    x48 = (x14 + x47);
    x49 = (x13 + x48);
    x50 = (x12 + x49);
    x51 = (x11 + x50);
    x52 = (x10 + x51);
    x53 = (x9 + x52);
    x54 = (x7 + (uint64_t)x8);
    x55 = (x6 + x54);
    x56 = (x5 + x55);
    x57 = (x4 + x56);
    x58 = (x3 + x57);
    x59 = (x2 + x58);
    x60 = (x1 + x59);
    out1[0] = x39;
    out1[1] = x46;
    out1[2] = x53;
    out1[3] = x60;
}